

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O1

void TTD::NSLogEvents::JsRTByteBufferAction_Emit<(TTD::NSLogEvents::EventKind)39>
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  ulong uVar1;
  bool bVar2;
  
  if (evt->EventKind == AllocateExternalArrayBufferActionTag) {
    (*writer->_vptr_FileWriter[3])(writer,0x12,1);
    bVar2 = false;
    NSSnapValues::EmitTTDVar(*(TTDVar *)(evt + 1),writer,NoSeparator);
    if (evt[1].EventTimeStamp == 0) {
      bVar2 = evt[2].EventKind != Invalid;
    }
    (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)bVar2,1);
    FileWriter::WriteLengthValue(writer,evt[2].EventKind,CommaSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    if ((bVar2 == false) && (evt[2].EventKind != Invalid)) {
      uVar1 = 0;
      do {
        (*writer->_vptr_FileWriter[0xb])
                  (writer,(ulong)*(byte *)(evt[1].EventTimeStamp + uVar1),(ulong)(uVar1 != 0));
        uVar1 = uVar1 + 1;
      } while (uVar1 < evt[2].EventKind);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTByteBufferAction_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTByteBufferAction* bufferAction = GetInlineEventDataAs<JsRTByteBufferAction, tag>(evt);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(bufferAction->Result, writer, NSTokens::Separator::NoSeparator);

            bool badValue = (bufferAction->Buffer == nullptr && bufferAction->Length > 0);
            writer->WriteBool(NSTokens::Key::boolVal, badValue, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(bufferAction->Length, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            if(!badValue)
            {
                for(uint32 i = 0; i < bufferAction->Length; ++i)
                {
                    writer->WriteNakedByte(bufferAction->Buffer[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
                }
            }
            writer->WriteSequenceEnd();
        }